

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# examine_stack.cc
# Opt level: O2

void absl::lts_20250127::debugging_internal::anon_unknown_0::DumpPCAndFrameSizeAndSymbol
               (OutputWriter *writer,void *writer_arg,void *pc,void *symbolize_pc,int framesize,
               char *prefix)

{
  char *__format;
  char buf [1024];
  char tmp [1024];
  
  Symbolize(symbolize_pc,tmp,0x400);
  if (framesize < 1) {
    __format = "%s@ %*p  (unknown)  %s\n";
  }
  else {
    __format = "%s@ %*p  %9d  %s\n";
  }
  snprintf(buf,0x400,__format,prefix,0x12,pc);
  (*writer)(buf,writer_arg);
  return;
}

Assistant:

void DumpPCAndFrameSizeAndSymbol(OutputWriter* writer, void* writer_arg,
                                 void* const pc, void* const symbolize_pc,
                                 int framesize, const char* const prefix) {
  char tmp[1024];
  const char* symbol = "(unknown)";
  if (absl::Symbolize(symbolize_pc, tmp, sizeof(tmp))) {
    symbol = tmp;
  }
  char buf[1024];
  if (framesize <= 0) {
    snprintf(buf, sizeof(buf), "%s@ %*p  (unknown)  %s\n", prefix,
             kPrintfPointerFieldWidth, pc, symbol);
  } else {
    snprintf(buf, sizeof(buf), "%s@ %*p  %9d  %s\n", prefix,
             kPrintfPointerFieldWidth, pc, framesize, symbol);
  }
  writer(buf, writer_arg);
}